

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

int Timidity::update_signal(Voice *v)

{
  bool bVar1;
  Voice *v_local;
  
  if (((v->eg1).field_0.env.bUpdating == '\0') || (bVar1 = Envelope::Update(&v->eg1,v), !bVar1)) {
    if (v->tremolo_phase_increment != 0) {
      update_tremolo(v);
    }
    apply_envelope_to_amp(v);
    v_local._4_4_ = 0;
  }
  else {
    v_local._4_4_ = 1;
  }
  return v_local._4_4_;
}

Assistant:

static int update_signal(Voice *v)
{
	if (v->eg1.env.bUpdating && v->eg1.Update(v))
	{
		return 1;
	}
	if (v->tremolo_phase_increment != 0)
	{
		update_tremolo(v);
	}
	apply_envelope_to_amp(v);
	return 0;
}